

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O2

void av1_update_frame_size(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  CommonTileParams *tiles;
  byte bVar1;
  SequenceHeader *pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  BLOCK_SIZE BVar6;
  int iVar7;
  undefined8 *puVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  qm_val_t *(*__src) [19];
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  (*(cpi->common).mi_params.set_mb_mi)
            (&(cpi->common).mi_params,(cpi->common).width,(cpi->common).height,
             (cpi->sf).part_sf.default_min_partition_size);
  lVar15 = 0xa30;
  if (((cpi->common).seq_params)->monochrome == '\0') {
    lVar15 = 0x1e90;
  }
  for (lVar16 = 0; lVar15 != lVar16; lVar16 = lVar16 + 0xa30) {
    if (*(char *)((long)(cpi->td).mb.e_mbd.plane[0].pre + lVar16 + -0x30) == '\0') {
      uVar3 = *(undefined8 *)(cpi->common).quant_params.y_dequant_QTX;
      uVar4 = *(undefined8 *)((cpi->common).quant_params.y_dequant_QTX + 2);
      uVar5 = *(undefined8 *)((cpi->common).quant_params.y_dequant_QTX + 6);
      puVar8 = (undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].seg_dequant_QTX[4] + lVar16);
      *puVar8 = *(undefined8 *)((cpi->common).quant_params.y_dequant_QTX + 4);
      puVar8[1] = uVar5;
      puVar8 = (undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].seg_dequant_QTX[0] + lVar16);
      *puVar8 = uVar3;
      puVar8[1] = uVar4;
      __src = (cpi->common).quant_params.y_iqmatrix;
    }
    else {
      puVar8 = (undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].seg_dequant_QTX[0] + lVar16);
      if (lVar16 == 0xa30) {
        uVar3 = *(undefined8 *)(cpi->common).quant_params.u_dequant_QTX;
        uVar4 = *(undefined8 *)((cpi->common).quant_params.u_dequant_QTX + 2);
        uVar5 = *(undefined8 *)((cpi->common).quant_params.u_dequant_QTX + 6);
        *(undefined8 *)((cpi->td).mb.e_mbd.plane[1].seg_dequant_QTX + 4) =
             *(undefined8 *)((cpi->common).quant_params.u_dequant_QTX + 4);
        *(undefined8 *)((cpi->td).mb.e_mbd.plane[1].seg_dequant_QTX + 6) = uVar5;
        *puVar8 = uVar3;
        *(undefined8 *)((cpi->td).mb.e_mbd.plane[1].seg_dequant_QTX + 2) = uVar4;
        __src = (cpi->common).quant_params.u_iqmatrix;
      }
      else {
        uVar3 = *(undefined8 *)(cpi->common).quant_params.v_dequant_QTX;
        uVar4 = *(undefined8 *)((cpi->common).quant_params.v_dequant_QTX + 2);
        uVar5 = *(undefined8 *)((cpi->common).quant_params.v_dequant_QTX + 6);
        *(undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].seg_dequant_QTX[4] + lVar16) =
             *(undefined8 *)((cpi->common).quant_params.v_dequant_QTX + 4);
        *(undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].seg_dequant_QTX[6] + lVar16) = uVar5;
        *puVar8 = uVar3;
        *(undefined8 *)((long)(cpi->td).mb.e_mbd.plane[0].seg_dequant_QTX[2] + lVar16) = uVar4;
        __src = (cpi->common).quant_params.v_iqmatrix;
      }
    }
    memcpy((void *)((long)(cpi->td).mb.e_mbd.plane[0].seg_iqmatrix[0] + lVar16),__src,0x4c0);
  }
  cm = &cpi->common;
  (cpi->td).mb.e_mbd.mi_stride = (cpi->common).mi_params.mi_stride;
  (cpi->td).mb.e_mbd.error_info = (cpi->common).error;
  cfl_init(&(cpi->td).mb.e_mbd.cfl,(cpi->common).seq_params);
  if (cpi->ppi->seq_params_locked == 0) {
    pSVar2 = (cpi->common).seq_params;
    BVar6 = av1_select_sb_size(&cpi->oxcf,(cpi->common).width,(cpi->common).height,
                               cpi->ppi->number_spatial_layers);
    pSVar2->sb_size = BVar6;
    pSVar2->mib_size =
         (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar6];
    pSVar2->mib_size_log2 = (uint)""[BVar6];
  }
  pSVar2 = (cpi->common).seq_params;
  tiles = &(cpi->common).tiles;
  av1_get_tile_limits(cm);
  iVar13 = (cpi->common).mi_params.mi_cols;
  bVar1 = (byte)pSVar2->mib_size_log2;
  iVar7 = (1 << (bVar1 & 0x1f)) + iVar13 + -1 >> (bVar1 & 0x1f);
  if (((cpi->oxcf).tile_cfg.tile_width_count == 0) || ((cpi->oxcf).tile_cfg.tile_height_count == 0))
  {
    (cpi->common).tiles.uniform_spacing = 1;
    iVar9 = (cpi->oxcf).tile_cfg.tile_columns;
    iVar11 = (cpi->common).tiles.min_log2_cols;
    if (iVar11 < iVar9) {
      iVar11 = iVar9;
    }
    iVar9 = -1;
    do {
      iVar9 = iVar9 + 1;
    } while ((cpi->common).tiles.max_width_sb << ((byte)iVar9 & 0x1f) <=
             (int)(iVar7 * (uint)(cpi->common).superres_scale_denominator + 4) / 8);
    if (iVar9 < iVar11) {
      iVar9 = iVar11;
    }
    iVar7 = (cpi->common).tiles.max_log2_cols;
    if (iVar7 <= iVar9) {
      iVar9 = iVar7;
    }
    (cpi->common).tiles.log2_cols = iVar9;
  }
  else if ((cpi->oxcf).tile_cfg.tile_widths[0] < 0) {
    auto_tile_size_balancing(cm,iVar7,(cpi->oxcf).tile_cfg.tile_columns,1);
    iVar13 = (cpi->common).mi_params.mi_cols;
  }
  else {
    (cpi->common).tiles.uniform_spacing = 0;
    iVar11 = 0;
    iVar9 = 0;
    for (uVar10 = 0; (iVar11 < iVar7 && (uVar10 < 0x40)); uVar10 = uVar10 + 1) {
      (cpi->common).tiles.col_start_sb[uVar10] = iVar11;
      iVar12 = iVar9 + 1;
      if ((cpi->oxcf).tile_cfg.tile_width_count <= iVar12) {
        iVar12 = 0;
      }
      iVar9 = (cpi->oxcf).tile_cfg.tile_widths[iVar9];
      iVar14 = (cpi->common).tiles.max_width_sb;
      if (iVar9 < iVar14) {
        iVar14 = iVar9;
      }
      iVar11 = iVar11 + iVar14;
      iVar9 = iVar12;
    }
    (cpi->common).tiles.cols = (int)uVar10;
    (cpi->common).tiles.col_start_sb[uVar10] = iVar7;
  }
  av1_calculate_tile_cols(pSVar2,(cpi->common).mi_params.mi_rows,iVar13,tiles);
  iVar13 = (cpi->common).mi_params.mi_rows;
  bVar1 = (byte)pSVar2->mib_size_log2;
  iVar7 = iVar13 + (1 << (bVar1 & 0x1f)) + -1 >> (bVar1 & 0x1f);
  if ((cpi->common).tiles.uniform_spacing == 0) {
    if ((cpi->oxcf).tile_cfg.tile_heights[0] < 0) {
      auto_tile_size_balancing(cm,iVar7,(cpi->oxcf).tile_cfg.tile_rows,0);
      iVar13 = (cpi->common).mi_params.mi_rows;
    }
    else {
      iVar11 = 0;
      iVar9 = 0;
      for (uVar10 = 0; (iVar11 < iVar7 && (uVar10 < 0x40)); uVar10 = uVar10 + 1) {
        (cpi->common).tiles.row_start_sb[uVar10] = iVar11;
        iVar12 = iVar9 + 1;
        if ((cpi->oxcf).tile_cfg.tile_height_count <= iVar12) {
          iVar12 = 0;
        }
        iVar9 = (cpi->oxcf).tile_cfg.tile_heights[iVar9];
        iVar14 = (cpi->common).tiles.max_height_sb;
        if (iVar9 < iVar14) {
          iVar14 = iVar9;
        }
        iVar11 = iVar11 + iVar14;
        iVar9 = iVar12;
      }
      (cpi->common).tiles.rows = (int)uVar10;
      (cpi->common).tiles.row_start_sb[uVar10] = iVar7;
    }
  }
  else {
    iVar7 = (cpi->oxcf).tile_cfg.tile_rows;
    iVar9 = (cpi->common).tiles.min_log2_rows;
    iVar11 = (cpi->common).tiles.max_log2_rows;
    if (iVar9 < iVar7) {
      iVar9 = iVar7;
    }
    if (iVar11 <= iVar9) {
      iVar9 = iVar11;
    }
    (cpi->common).tiles.log2_rows = iVar9;
  }
  av1_calculate_tile_rows(pSVar2,iVar13,tiles);
  return;
}

Assistant:

void av1_update_frame_size(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;

  // Setup mi_params here in case we need more mi's.
  CommonModeInfoParams *const mi_params = &cm->mi_params;
  mi_params->set_mb_mi(mi_params, cm->width, cm->height,
                       cpi->sf.part_sf.default_min_partition_size);

  av1_init_macroblockd(cm, xd);

  if (!cpi->ppi->seq_params_locked)
    set_sb_size(cm->seq_params,
                av1_select_sb_size(&cpi->oxcf, cm->width, cm->height,
                                   cpi->ppi->number_spatial_layers));

  set_tile_info(cm, &cpi->oxcf.tile_cfg);
}